

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O3

void __thiscall
GmmLib::GmmGen7TextureCalc::Fill2DTexOffsetAddress
          (GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint32_t UnitAlignment;
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  GMM_GFX_SIZE_T GVar5;
  undefined4 extraout_var;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint local_3c;
  uint32_t local_38;
  uint32_t CompressHeight;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  
  if (pTexInfo != (GMM_TEXTURE_INFO *)0x0) {
    if (((pTexInfo->ArraySize < 2) && (pTexInfo->Type != RESOURCE_CUBE)) &&
       (((ulong)(pTexInfo->Flags).Gpu & 0x18) == 0)) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = 0;
    }
    else {
      uVar3 = pTexInfo->BaseHeight;
      UnitAlignment = (pTexInfo->Alignment).VAlign;
      uVar6 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar6 = (pTexInfo->MSAA).NumSamples;
      }
      uVar2 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar3,UnitAlignment,uVar6);
      uVar6 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar6 = (pTexInfo->MSAA).NumSamples;
      }
      uVar3 = GmmTextureCalc::ExpandHeight
                        (&this->super_GmmTextureCalc,uVar3 >> 1,UnitAlignment,uVar6);
      uVar8 = uVar2 + UnitAlignment * 0xc + uVar3;
      if ((pTexInfo->Alignment).ArraySpacingSingleLod != '\0') {
        uVar8 = uVar2;
      }
      uVar1 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
      if (uVar1 == '\0') {
        uVar9 = (ulong)(uVar8 >> ((byte)((uint)*(undefined4 *)&(pTexInfo->Flags).Gpu >> 0x1d) & 1));
      }
      else {
        GmmTextureCalc::GetCompressionBlockDimensions
                  (&this->super_GmmTextureCalc,pTexInfo->Format,&local_38,&local_3c,&CompressHeight)
        ;
        uVar9 = (ulong)uVar8 / (ulong)local_3c;
      }
      uVar8 = (pTexInfo->MSAA).NumSamples;
      if (1 < uVar8) {
        uVar7 = 1;
        if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
          uVar7 = uVar8;
        }
        uVar9 = (ulong)((int)uVar9 * uVar7);
      }
      GVar5 = uVar9 * pTexInfo->Pitch;
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = GVar5;
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar5;
    }
    uVar9 = 0;
    do {
      iVar4 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[8])(this,pTexInfo,uVar9);
      *(ulong *)(pTexInfo->MmcHint + uVar9 * 8 + 0x80) = CONCAT44(extraout_var,iVar4);
      uVar8 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar8;
    } while (uVar8 <= pTexInfo->MaxLod);
  }
  return;
}

Assistant:

void GmmLib::GmmGen7TextureCalc::Fill2DTexOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t i;

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);

    GMM_DPF_ENTER;

    // QPitch: Array Element-to-Element, or Cube Face-to-Face Pitch...
    // -------------------------------------------------------------------------
    // Note: Gen7 MSAA RT samples stored as contiguous array planes--
    // e.g. MSAA-4X'ed array elements A and B stored: A0 A1 A2 A3 B0 B1 B2 B3.
    // However, for GMM's purposes QPitch is still the distance between
    // elements--not the distance between samples.
    // -------------------------------------------------------------------------
    if((pTexInfo->ArraySize <= 1) &&
       (pTexInfo->Type != RESOURCE_CUBE) &&
       !(pTexInfo->Flags.Gpu.ColorSeparation ||
         pTexInfo->Flags.Gpu.ColorSeparationRGBX))
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = 0;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = 0;
    }
    else
    {
        uint32_t Height, Height0, Height1, ArrayQPitch, VAlign;

        Height = pTexInfo->BaseHeight;

        VAlign = pTexInfo->Alignment.VAlign;

        Height0 = __GMM_EXPAND_HEIGHT(this, Height, VAlign, pTexInfo);
        Height1 = __GMM_EXPAND_HEIGHT(this, Height >> 1, VAlign, pTexInfo);

        if(!pTexInfo->Alignment.ArraySpacingSingleLod)
        {
            // QPitch = (h0 + h1 + 12j) * pitch
            ArrayQPitch = Height0 + Height1 + 12 * VAlign;
        }
        else // SURFACE_STATE: Surface Array Spacing: ARYSPC_LOD0
        {
            // QPitch = h0 * pitch
            ArrayQPitch = Height0;
        }

        if(GmmIsCompressed(pGmmLibContext, pTexInfo->Format))
        {
            uint32_t CompressHeight, CompressWidth, CompressDepth;

            GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

            ArrayQPitch /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            ArrayQPitch /= 2;
        }

        if((pTexInfo->MSAA.NumSamples > 1) && !(pTexInfo->Flags.Gpu.Depth || pTexInfo->Flags.Gpu.SeparateStencil))
        {
            // Gen7 MSAA (non-Depth/Stencil) RT samples stored as array planes;
            // QPitch still element-to-element, not sample-to-sample.
            ArrayQPitch *= pTexInfo->MSAA.NumSamples;
        }

        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender = ArrayQPitch * pTexInfo->Pitch;
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock   = ArrayQPitch * pTexInfo->Pitch;
    }

    for(i = 0; i <= pTexInfo->MaxLod; i++)
    {
        pTexInfo->OffsetInfo.Texture2DOffsetInfo.Offset[i] = Get2DTexOffsetAddressPerMip(pTexInfo, i);
    }

    GMM_DPF_EXIT;
}